

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::CreateGlobalTarget(cmGlobalGenerator *this,GlobalTargetInfo *gti,cmMakefile *mf)

{
  pointer pcVar1;
  pointer pbVar2;
  char *pcVar3;
  int iVar4;
  cmTarget *this_00;
  string *d;
  pointer name;
  char *__s;
  pair<cmTarget_&,_bool> pVar5;
  cmCustomCommand cc;
  string local_1c0;
  string local_1a0;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_180;
  undefined1 local_168 [32];
  pointer local_148;
  pointer pbStack_140;
  pointer local_138;
  pointer pbStack_130;
  pointer local_128;
  pointer pcStack_120;
  pointer local_118;
  pointer pcStack_110;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_108;
  pointer local_f8;
  pointer ppStack_f0;
  pointer local_e8;
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  char *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined2 local_40;
  bool local_3e;
  undefined4 local_3d;
  PolicyStatus local_38;
  
  pVar5 = cmMakefile::CreateNewTarget(mf,&gti->Name,GLOBAL_TARGET,gti->PerConfig);
  this_00 = pVar5.first;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_168._0_8_ = local_168 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"EXCLUDE_FROM_ALL","");
    cmTarget::SetProperty(this_00,(string *)local_168,"TRUE");
    if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    }
    local_118 = (pointer)0x0;
    pcStack_110 = (pointer)0x0;
    local_128 = (pointer)0x0;
    pcStack_120 = (pointer)0x0;
    local_138 = (pointer)0x0;
    pbStack_130 = (pointer)0x0;
    local_148 = (pointer)0x0;
    pbStack_140 = (pointer)0x0;
    local_168._16_8_ = 0;
    local_168._24_8_ = 0;
    local_168._0_8_ = (pointer)0x0;
    local_168._8_8_ = (pointer)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_108);
    local_e0._M_p = (pointer)&local_d0;
    local_f8 = (pointer)0x0;
    ppStack_f0 = (pointer)0x0;
    local_e8 = (pointer)0x0;
    local_d8 = 0;
    local_d0._M_local_buf[0] = '\0';
    local_c0._M_p = (pointer)&local_b0;
    local_b8 = 0;
    local_b0._M_local_buf[0] = '\0';
    local_a0._M_p = (pointer)&local_90;
    local_98 = (char *)0x0;
    local_90._M_local_buf[0] = '\0';
    local_80._M_p = (pointer)&local_70;
    local_78 = 0;
    local_70._M_local_buf[0] = '\0';
    local_60._M_p = (pointer)&local_50;
    local_58 = 0;
    local_50._M_local_buf[0] = '\0';
    local_40._0_1_ = false;
    local_40._1_1_ = false;
    local_3e = true;
    local_3d._0_1_ = false;
    local_3d._1_1_ = false;
    local_3d._2_1_ = false;
    local_3d._3_1_ = false;
    local_38 = WARN;
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_180,
               &(gti->CommandLines).
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
    cmCustomCommand::SetCommandLines
              ((cmCustomCommand *)local_168,(cmCustomCommandLines *)&local_180);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_180);
    pcVar3 = local_98;
    pcVar1 = (gti->WorkingDir)._M_dataplus._M_p;
    __s = "";
    if (pcVar1 != (pointer)0x0) {
      __s = pcVar1;
    }
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,pcVar3,(ulong)__s);
    local_3d._2_1_ = gti->StdPipesUTF8;
    cmCustomCommand::SetUsesTerminal((cmCustomCommand *)local_168,gti->UsesTerminal);
    cmTarget::AddPostBuildCommand(this_00,(cmCustomCommand *)local_168);
    if ((gti->Message)._M_string_length != 0) {
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"EchoString","");
      cmTarget::SetProperty(this_00,&local_1c0,(cmValue)&gti->Message);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
    }
    pbVar2 = (gti->Depends).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (name = (gti->Depends).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; name != pbVar2; name = name + 1) {
      cmTarget::AddUtility(this_00,name,false,(cmMakefile *)0x0);
    }
    iVar4 = (*this->_vptr_cmGlobalGenerator[0x2c])(this);
    if ((char)iVar4 != '\0') {
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"FOLDER","");
      GetPredefinedTargetsFolder_abi_cxx11_(&local_1a0,this);
      cmTarget::SetProperty(this_00,&local_1c0,&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
    }
    cmCustomCommand::~cmCustomCommand((cmCustomCommand *)local_168);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateGlobalTarget(GlobalTargetInfo const& gti,
                                           cmMakefile* mf)
{
  // Package
  auto tb =
    mf->CreateNewTarget(gti.Name, cmStateEnums::GLOBAL_TARGET, gti.PerConfig);

  // Do nothing if gti.Name is already used
  if (!tb.second) {
    return;
  }

  cmTarget& target = tb.first;
  target.SetProperty("EXCLUDE_FROM_ALL", "TRUE");

  // Store the custom command in the target.
  cmCustomCommand cc;
  cc.SetCommandLines(gti.CommandLines);
  cc.SetWorkingDirectory(gti.WorkingDir.c_str());
  cc.SetStdPipesUTF8(gti.StdPipesUTF8);
  cc.SetUsesTerminal(gti.UsesTerminal);
  target.AddPostBuildCommand(std::move(cc));
  if (!gti.Message.empty()) {
    target.SetProperty("EchoString", gti.Message);
  }
  for (std::string const& d : gti.Depends) {
    target.AddUtility(d, false);
  }

  // Organize in the "predefined targets" folder:
  //
  if (this->UseFolderProperty()) {
    target.SetProperty("FOLDER", this->GetPredefinedTargetsFolder());
  }
}